

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  string ruleVar;
  string local_80;
  string local_60;
  string local_40;
  
  psVar3 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_80,this);
  bVar2 = cmGeneratorTarget::HasImplibGNUtoMS(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar2) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_(&local_60,this);
    cmGeneratorTarget::GetLinkerLanguage(&local_40,pcVar1,&local_60);
    cmStrCat<char_const(&)[7],std::__cxx11::string,char_const(&)[14]>
              (&local_80,(char (*) [7])0x72f1a0,&local_40,(char (*) [14])"_GNUtoMS_RULE");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    cVar4 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_80);
    if (cVar4.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->GetConfigName())) {
    std::string ruleVar =
      cmStrCat("CMAKE_",
               this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName()),
               "_GNUtoMS_RULE");
    if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += *rule;
    }
  }
  return linkRule;
}